

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-million-async.c
# Opt level: O2

int run_benchmark_million_async(void)

{
  uint *puVar1;
  int iVar2;
  uv_loop_t *puVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  uv_async_t *handle;
  undefined8 uStackY_e0;
  uv_timer_t timer_handle;
  
  puVar3 = uv_default_loop();
  container = (async_container *)malloc(0x8000008);
  if (container == (async_container *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-async.c"
            ,0x59,"container","!=","NULL",0,"!=",0);
    abort();
  }
  puVar1 = &container->handles_seen;
  container->async_events = 0;
  *puVar1 = 0;
  lVar7 = 8;
  do {
    if (lVar7 == 0x8000008) {
      iVar2 = uv_timer_init(puVar3,&timer_handle);
      if (iVar2 == 0) {
        iVar2 = uv_timer_start(&timer_handle,timer_cb,5000,0);
        if (iVar2 == 0) {
          iVar2 = uv_thread_create(&thread_id,thread_cb,(void *)0x0);
          if (iVar2 == 0) {
            iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
            if (iVar2 == 0) {
              pcVar6 = fmt((double)container->async_events);
              pcVar4 = fmt((double)container->async_events / 5.0);
              pcVar5 = fmt((double)container->handles_seen);
              printf("%s async events in %.1f seconds (%s/s, %s unique handles seen)\n",
                     0x4014000000000000,pcVar6,pcVar4,pcVar5);
              free(container);
              puVar3 = uv_default_loop();
              uv_walk(puVar3,close_walk_cb,(void *)0x0);
              uv_run(puVar3,UV_RUN_DEFAULT);
              puVar3 = uv_default_loop();
              iVar2 = uv_loop_close(puVar3);
              if (iVar2 == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar6 = "0 == uv_loop_close(uv_default_loop())";
              uStackY_e0 = 0x6e;
            }
            else {
              pcVar6 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
              uStackY_e0 = 0x66;
            }
          }
          else {
            pcVar6 = "0 == uv_thread_create(&thread_id, thread_cb, NULL)";
            uStackY_e0 = 0x65;
          }
        }
        else {
          pcVar6 = "0 == uv_timer_start(&timer_handle, timer_cb, timeout, 0)";
          uStackY_e0 = 100;
        }
      }
      else {
        pcVar6 = "0 == uv_timer_init(loop, &timer_handle)";
        uStackY_e0 = 99;
      }
LAB_001079ac:
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-async.c"
              ,uStackY_e0,pcVar6);
      abort();
    }
    handle = (uv_async_t *)((long)container->async_handles[0].handle_queue + lVar7 + -0x28);
    iVar2 = uv_async_init(puVar3,handle,async_cb);
    if (iVar2 != 0) {
      pcVar6 = "0 == uv_async_init(loop, handle, async_cb)";
      uStackY_e0 = 0x5f;
      goto LAB_001079ac;
    }
    handle->data = (void *)0x0;
    lVar7 = lVar7 + 0x80;
  } while( true );
}

Assistant:

BENCHMARK_IMPL(million_async) {
  uv_timer_t timer_handle;
  uv_async_t* handle;
  uv_loop_t* loop;
  int timeout;
  unsigned i;

  loop = uv_default_loop();
  timeout = 5000;

  container = malloc(sizeof(*container));
  ASSERT_NOT_NULL(container);
  container->async_events = 0;
  container->handles_seen = 0;

  for (i = 0; i < ARRAY_SIZE(container->async_handles); i++) {
    handle = container->async_handles + i;
    ASSERT(0 == uv_async_init(loop, handle, async_cb));
    handle->data = NULL;
  }

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, timeout, 0));
  ASSERT(0 == uv_thread_create(&thread_id, thread_cb, NULL));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  printf("%s async events in %.1f seconds (%s/s, %s unique handles seen)\n",
          fmt(container->async_events),
          timeout / 1000.,
          fmt(container->async_events / (timeout / 1000.)),
          fmt(container->handles_seen));
  free(container);

  MAKE_VALGRIND_HAPPY();
  return 0;
}